

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::getSentenceVector(FastText *this,istream *in,Vector *svec)

{
  bool bVar1;
  element_type *peVar2;
  Vector *this_00;
  Vector *pVVar3;
  size_type sVar4;
  istream *piVar5;
  FastText *in_RDX;
  istream *in_RSI;
  real rVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  real norm;
  int32_t count;
  string word;
  istringstream iss;
  string sentence;
  Vector vec;
  int32_t i;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  Vector *in_stack_fffffffffffffd90;
  Vector *in_stack_fffffffffffffd98;
  string *this_01;
  FastText *in_stack_fffffffffffffda0;
  FastText *in_stack_fffffffffffffda8;
  Vector *in_stack_fffffffffffffdb0;
  int local_22c;
  string local_228 [8];
  string *in_stack_fffffffffffffde0;
  Vector *in_stack_fffffffffffffde8;
  FastText *in_stack_fffffffffffffdf0;
  istringstream local_208 [96];
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe58;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe60;
  istream *in_stack_fffffffffffffe68;
  Dictionary *in_stack_fffffffffffffe70;
  string local_88 [48];
  int local_58;
  vector<int,_std::allocator<int>_> local_30;
  FastText *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Vector::zero((Vector *)in_stack_fffffffffffffda0);
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1bbbf3);
  if (peVar2->model == sup) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bbc12);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bbc24);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1bbc32);
    Dictionary::getLine(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                        in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_58 = 0;
    while( true ) {
      rVar6 = (real)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      this_00 = (Vector *)(long)local_58;
      pVVar3 = (Vector *)std::vector<int,_std::allocator<int>_>::size(&local_30);
      auVar7 = in_ZMM0._0_16_;
      if (pVVar3 <= this_00) break;
      in_stack_fffffffffffffda8 = local_18;
      std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_58);
      addInputVector(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                     (int32_t)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      local_58 = local_58 + 1;
    }
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0);
    if (!bVar1) {
      sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_30);
      vcvtusi2sd_avx512f(auVar7,sVar4);
      Vector::mul(this_00,rVar6);
      in_stack_fffffffffffffda0 = local_18;
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0);
  }
  else {
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1bbd75);
    Vector::Vector(in_stack_fffffffffffffd90,
                   CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    this_01 = local_88;
    std::__cxx11::string::string(this_01);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,this_01);
    std::__cxx11::istringstream::istringstream(local_208,local_88,_S_in);
    std::__cxx11::string::string(local_228);
    local_22c = 0;
    while( true ) {
      piVar5 = std::operator>>((istream *)local_208,local_228);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar1) break;
      getWordVector(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      rVar6 = Vector::norm(in_stack_fffffffffffffdb0);
      if (0.0 < rVar6) {
        Vector::mul(in_stack_fffffffffffffdb0,(real)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        Vector::addVector(in_stack_fffffffffffffdb0,(Vector *)in_stack_fffffffffffffda8);
        local_22c = local_22c + 1;
      }
    }
    if (0 < local_22c) {
      Vector::mul(in_stack_fffffffffffffdb0,(real)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    }
    std::__cxx11::string::~string(local_228);
    std::__cxx11::istringstream::~istringstream(local_208);
    std::__cxx11::string::~string(local_88);
    Vector::~Vector((Vector *)0x1bbf54);
  }
  return;
}

Assistant:

void FastText::getSentenceVector(std::istream& in, fasttext::Vector& svec) {
  svec.zero();
  if (args_->model == model_name::sup) {
    std::vector<int32_t> line, labels;
    dict_->getLine(in, line, labels);
    for (int32_t i = 0; i < line.size(); i++) {
      addInputVector(svec, line[i]);
    }
    if (!line.empty()) {
      svec.mul(1.0 / line.size());
    }
  } else {
    Vector vec(args_->dim);
    std::string sentence;
    std::getline(in, sentence);
    std::istringstream iss(sentence);
    std::string word;
    int32_t count = 0;
    while (iss >> word) {
      getWordVector(vec, word);
      real norm = vec.norm();
      if (norm > 0) {
        vec.mul(1.0 / norm);
        svec.addVector(vec);
        count++;
      }
    }
    if (count > 0) {
      svec.mul(1.0 / count);
    }
  }
}